

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManResolve(Cbs2_Man_t *p,int Level,int hClause0,int hClause1)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  piVar5 = (p->pClauses).pData;
  lVar9 = (long)Level;
  iVar4 = piVar5[lVar9 + 1];
  if (iVar4 == 0) {
    __assert_fail("pQue->pData[hClause0+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x39d,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  lVar6 = (long)hClause0;
  if (iVar4 != piVar5[lVar6 + 1]) {
    __assert_fail("pQue->pData[hClause0+1] == pQue->pData[hClause1+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x39e,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  iVar4 = (p->pClauses).iTail;
  if ((p->pClauses).iHead != iVar4) {
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x3a3,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  iVar1 = (p->pClauses).nSize;
  if (iVar4 == iVar1) {
    (p->pClauses).nSize = iVar1 * 2;
    piVar5 = (p->pClauses).pData;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar1 << 3);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)iVar1 << 3);
    }
    (p->pClauses).pData = piVar5;
  }
  piVar5 = (p->pClauses).pData;
  iVar4 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar4 + 1;
  piVar5[iVar4] = 0;
  iVar4 = (p->pClauses).nSize;
  if ((p->pClauses).iTail == iVar4) {
    (p->pClauses).nSize = iVar4 * 2;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar4 << 3);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
    }
    (p->pClauses).pData = piVar5;
  }
  iVar4 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar4 + 1;
  (p->pClauses).pData[iVar4] = 0;
  piVar5 = (p->pClauses).pData;
  iVar4 = -1;
  if (1 < piVar5[lVar9]) {
    lVar7 = 1;
    do {
      uVar2 = piVar5[lVar9 + lVar7 + 1];
      uVar8 = (ulong)uVar2;
      if (uVar8 == 0) break;
      if (((int)uVar2 < 0) || ((p->vMark).nSize <= (int)uVar2)) goto LAB_0071d34a;
      pcVar3 = (p->vMark).pArray;
      if (pcVar3[uVar8] == '\0') {
        pcVar3[uVar8] = '\x01';
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          piVar5 = (p->pClauses).pData;
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc((long)iVar1 << 3);
          }
          else {
            piVar5 = (int *)realloc(piVar5,(long)iVar1 << 3);
          }
          (p->pClauses).pData = piVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = uVar2;
        if ((p->vLevReason).nSize <= (int)(uVar2 * 3)) goto LAB_0071d369;
        iVar1 = (p->vLevReason).pArray[uVar8 * 3];
        if (iVar1 == -1) goto LAB_0071d388;
        if (iVar4 <= iVar1) {
          iVar4 = iVar1;
        }
      }
      piVar5 = (p->pClauses).pData;
      lVar7 = lVar7 + 1;
    } while (lVar7 < piVar5[lVar9]);
  }
  piVar5 = (p->pClauses).pData;
  if (1 < piVar5[lVar6]) {
    lVar9 = 1;
    do {
      uVar2 = piVar5[lVar6 + lVar9 + 1];
      uVar8 = (ulong)uVar2;
      if (uVar8 == 0) break;
      if (((int)uVar2 < 0) || ((p->vMark).nSize <= (int)uVar2)) {
LAB_0071d34a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      pcVar3 = (p->vMark).pArray;
      if (pcVar3[uVar8] == '\0') {
        pcVar3[uVar8] = '\x01';
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          piVar5 = (p->pClauses).pData;
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc((long)iVar1 << 3);
          }
          else {
            piVar5 = (int *)realloc(piVar5,(long)iVar1 << 3);
          }
          (p->pClauses).pData = piVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = uVar2;
        if ((p->vLevReason).nSize <= (int)(uVar2 * 3)) {
LAB_0071d369:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vLevReason).pArray[uVar8 * 3];
        if (iVar1 == -1) {
LAB_0071d388:
          __assert_fail("!Cbs2_VarUnused(p, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x8f,"int Cbs2_VarDecLevel(Cbs2_Man_t *, int)");
        }
        if (iVar4 <= iVar1) {
          iVar4 = iVar1;
        }
      }
      piVar5 = (p->pClauses).pData;
      lVar9 = lVar9 + 1;
    } while (lVar9 < piVar5[lVar6]);
  }
  iVar1 = (p->pClauses).iHead;
  if (iVar1 + 2 < (p->pClauses).iTail) {
    lVar9 = (long)iVar1 + 2;
    do {
      iVar1 = (p->pClauses).pData[lVar9];
      if (((long)iVar1 < 0) || ((p->vMark).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vMark).pArray[iVar1] = '\0';
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->pClauses).iTail);
  }
  iVar4 = Cbs2_ManDeriveReason(p,iVar4);
  return iVar4;
}

Assistant:

static inline int Cbs2_ManResolve( Cbs2_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, iObj, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0+1] != 0 );
    assert( pQue->pData[hClause0+1] == pQue->pData[hClause1+1] );
    //Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    //Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
//    for ( i = hClause0 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
//    for ( i = hClause1 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
        Cbs2_VarSetMark0(p, pQue->pData[i], 0);
    return Cbs2_ManDeriveReason( p, LevelMax );
}